

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O2

void __thiscall
duckdb::HistogramBinState<long>::InitializeBins<duckdb::HistogramFunctor>
          (HistogramBinState<long> *this,Vector *bin_vector,idx_t count,idx_t pos,
          AggregateInputData *aggr_input)

{
  size_type __n;
  sel_t *psVar1;
  vector<long,_false> *this_00;
  pointer plVar2;
  unsafe_vector<long> *puVar3;
  unsafe_vector<idx_t> *puVar4;
  Vector *this_01;
  idx_t count_00;
  BinderException *pBVar5;
  ulong uVar6;
  size_type sVar7;
  ulong uVar8;
  idx_t i;
  bool bVar9;
  allocator local_e1;
  string local_e0;
  UnifiedVectorFormat bin_child_data;
  UnifiedVectorFormat bin_data;
  
  puVar3 = (unsafe_vector<long> *)operator_new(0x18);
  (puVar3->super_vector<long,_std::allocator<long>_>).
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (puVar3->super_vector<long,_std::allocator<long>_>).
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (puVar3->super_vector<long,_std::allocator<long>_>).
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  this->bin_boundaries = puVar3;
  puVar4 = (unsafe_vector<idx_t> *)operator_new(0x18);
  (puVar4->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (puVar4->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (puVar4->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->counts = puVar4;
  UnifiedVectorFormat::UnifiedVectorFormat(&bin_data);
  Vector::ToUnifiedFormat(bin_vector,count,&bin_data);
  if ((bin_data.sel)->sel_vector != (sel_t *)0x0) {
    pos = (idx_t)(bin_data.sel)->sel_vector[pos];
  }
  uVar8 = *(ulong *)(bin_data.data + pos * 0x10);
  __n = *(size_type *)(bin_data.data + pos * 0x10 + 8);
  if ((bin_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
       (unsigned_long *)0x0) &&
     ((bin_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[pos >> 6] >>
       (pos & 0x3f) & 1) == 0)) {
    pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&bin_child_data,"Histogram bin list cannot be NULL",(allocator *)&local_e0)
    ;
    BinderException::BinderException(pBVar5,(string *)&bin_child_data);
    __cxa_throw(pBVar5,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this_01 = ListVector::GetEntry(bin_vector);
  count_00 = ListVector::GetListSize(bin_vector);
  UnifiedVectorFormat::UnifiedVectorFormat(&bin_child_data);
  Vector::ToUnifiedFormat(this_01,count_00,&bin_child_data);
  ::std::vector<long,_std::allocator<long>_>::reserve
            (&this->bin_boundaries->super_vector<long,_std::allocator<long>_>,__n);
  sVar7 = __n;
  do {
    bVar9 = sVar7 == 0;
    sVar7 = sVar7 - 1;
    if (bVar9) {
      ::std::
      __sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                ((this->bin_boundaries->super_vector<long,_std::allocator<long>_>).
                 super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                 _M_start,(this->bin_boundaries->super_vector<long,_std::allocator<long>_>).
                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_finish);
      uVar8 = 1;
      while( true ) {
        this_00 = this->bin_boundaries;
        plVar2 = (this_00->super_vector<long,_std::allocator<long>_>).
                 super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        if ((ulong)((long)(this_00->super_vector<long,_std::allocator<long>_>).
                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)plVar2 >> 3) <= uVar8) break;
        if (plVar2[uVar8 - 1] == plVar2[uVar8]) {
          vector<long,_false>::unsafe_erase_at(this_00,uVar8);
          uVar8 = uVar8 - 1;
        }
        uVar8 = uVar8 + 1;
      }
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&this->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>,__n + 1)
      ;
      UnifiedVectorFormat::~UnifiedVectorFormat(&bin_child_data);
      UnifiedVectorFormat::~UnifiedVectorFormat(&bin_data);
      return;
    }
    psVar1 = (bin_child_data.sel)->sel_vector;
    uVar6 = uVar8;
    if (psVar1 != (sel_t *)0x0) {
      uVar6 = (ulong)psVar1[uVar8];
    }
    if (bin_child_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if ((bin_child_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
           [uVar6 >> 6] >> (uVar6 & 0x3f) & 1) == 0) {
        pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_e0,"Histogram bin entry cannot be NULL",&local_e1);
        BinderException::BinderException(pBVar5,&local_e0);
        __cxa_throw(pBVar5,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar6 = uVar8;
    if (psVar1 != (sel_t *)0x0) {
      uVar6 = (ulong)psVar1[uVar8];
    }
    local_e0._M_dataplus._M_p = *(pointer *)(bin_child_data.data + uVar6 * 8);
    ::std::vector<long,_std::allocator<long>_>::emplace_back<long>
              (&this->bin_boundaries->super_vector<long,_std::allocator<long>_>,(long *)&local_e0);
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void InitializeBins(Vector &bin_vector, idx_t count, idx_t pos, AggregateInputData &aggr_input) {
		bin_boundaries = new unsafe_vector<T>();
		counts = new unsafe_vector<idx_t>();
		UnifiedVectorFormat bin_data;
		bin_vector.ToUnifiedFormat(count, bin_data);
		auto bin_counts = UnifiedVectorFormat::GetData<list_entry_t>(bin_data);
		auto bin_index = bin_data.sel->get_index(pos);
		auto bin_list = bin_counts[bin_index];
		if (!bin_data.validity.RowIsValid(bin_index)) {
			throw BinderException("Histogram bin list cannot be NULL");
		}

		auto &bin_child = ListVector::GetEntry(bin_vector);
		auto bin_count = ListVector::GetListSize(bin_vector);
		UnifiedVectorFormat bin_child_data;
		auto extra_state = OP::CreateExtraState(bin_count);
		OP::PrepareData(bin_child, bin_count, extra_state, bin_child_data);

		bin_boundaries->reserve(bin_list.length);
		for (idx_t i = 0; i < bin_list.length; i++) {
			auto bin_child_idx = bin_child_data.sel->get_index(bin_list.offset + i);
			if (!bin_child_data.validity.RowIsValid(bin_child_idx)) {
				throw BinderException("Histogram bin entry cannot be NULL");
			}
			bin_boundaries->push_back(OP::template ExtractValue<T>(bin_child_data, bin_list.offset + i, aggr_input));
		}
		// sort the bin boundaries
		std::sort(bin_boundaries->begin(), bin_boundaries->end());
		// ensure there are no duplicate bin boundaries
		for (idx_t i = 1; i < bin_boundaries->size(); i++) {
			if (Equals::Operation((*bin_boundaries)[i - 1], (*bin_boundaries)[i])) {
				bin_boundaries->erase_at(i);
				i--;
			}
		}

		counts->resize(bin_list.length + 1);
	}